

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void cfgfile::generator::close_namespace(ostream *stream,namespace_stack_t *stack)

{
  pointer *pppnVar1;
  ostream *poVar2;
  string *psVar3;
  
  poVar2 = std::operator<<(stream,"} /* namespace ");
  psVar3 = cfg::namespace_t::name_abi_cxx11_
                     ((stack->
                      super__Vector_base<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish[-1]);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  std::operator<<(poVar2," */\n\n");
  pppnVar1 = &(stack->
              super__Vector_base<const_cfgfile::generator::cfg::namespace_t_*,_std::allocator<const_cfgfile::generator::cfg::namespace_t_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  *pppnVar1 = *pppnVar1 + -1;
  return;
}

Assistant:

static inline void close_namespace( std::ostream & stream,
	namespace_stack_t & stack )
{
	stream << "} /* namespace "
		<< stack.back()->name()
		<< " */\n\n";

	stack.pop_back();
}